

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::printSummaryRow
          (ConsoleReporter *this,string *label,
          vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
          *cols,size_t row)

{
  bool bVar1;
  pointer pSVar2;
  const_reference pvVar3;
  ulong uVar4;
  ostream *poVar5;
  Colour local_67;
  Colour local_66;
  Colour local_65 [13];
  undefined1 local_58 [8];
  string value;
  __normal_iterator<const_Catch::ConsoleReporter::SummaryColumn_*,_std::vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>_>
  local_30;
  const_iterator it;
  size_t row_local;
  vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
  *cols_local;
  string *label_local;
  ConsoleReporter *this_local;
  
  it._M_current = (SummaryColumn *)row;
  local_30._M_current =
       (SummaryColumn *)
       std::
       vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
       ::begin(cols);
  while( true ) {
    value.field_2._8_8_ =
         std::
         vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
         ::end(cols);
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<const_Catch::ConsoleReporter::SummaryColumn_*,_std::vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>_>
                        *)((long)&value.field_2 + 8));
    if (!bVar1) break;
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_Catch::ConsoleReporter::SummaryColumn_*,_std::vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>_>
             ::operator->(&local_30);
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&pSVar2->rows,(size_type)it._M_current);
    std::__cxx11::string::string((string *)local_58,(string *)pvVar3);
    __gnu_cxx::
    __normal_iterator<const_Catch::ConsoleReporter::SummaryColumn_*,_std::vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>_>
    ::operator->(&local_30);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_58,"0");
      if (bVar1) {
        poVar5 = (this->super_StreamingReporterBase).stream;
        Colour::Colour(&local_66,FileName);
        poVar5 = Catch::operator<<(poVar5,&local_66);
        std::operator<<(poVar5," | ");
        Colour::~Colour(&local_66);
        poVar5 = (this->super_StreamingReporterBase).stream;
        pSVar2 = __gnu_cxx::
                 __normal_iterator<const_Catch::ConsoleReporter::SummaryColumn_*,_std::vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>_>
                 ::operator->(&local_30);
        Colour::Colour(&local_67,pSVar2->colour);
        poVar5 = Catch::operator<<(poVar5,&local_67);
        poVar5 = std::operator<<(poVar5,(string *)local_58);
        poVar5 = std::operator<<(poVar5,' ');
        pSVar2 = __gnu_cxx::
                 __normal_iterator<const_Catch::ConsoleReporter::SummaryColumn_*,_std::vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>_>
                 ::operator->(&local_30);
        std::operator<<(poVar5,(string *)pSVar2);
        Colour::~Colour(&local_67);
      }
    }
    else {
      poVar5 = std::operator<<((this->super_StreamingReporterBase).stream,(string *)label);
      std::operator<<(poVar5,": ");
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_58,"0");
      if (bVar1) {
        std::operator<<((this->super_StreamingReporterBase).stream,(string *)local_58);
      }
      else {
        poVar5 = (this->super_StreamingReporterBase).stream;
        Colour::Colour(local_65,ReconstructedExpression);
        poVar5 = Catch::operator<<(poVar5,local_65);
        std::operator<<(poVar5,"- none -");
        Colour::~Colour(local_65);
      }
    }
    std::__cxx11::string::~string((string *)local_58);
    __gnu_cxx::
    __normal_iterator<const_Catch::ConsoleReporter::SummaryColumn_*,_std::vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>_>
    ::operator++(&local_30);
  }
  std::operator<<((this->super_StreamingReporterBase).stream,'\n');
  return;
}

Assistant:

void printSummaryRow( std::string const& label, std::vector<SummaryColumn> const& cols, std::size_t row ) {
            for( std::vector<SummaryColumn>::const_iterator it = cols.begin(); it != cols.end(); ++it ) {
                std::string value = it->rows[row];
                if( it->label.empty() ) {
                    stream << label << ": ";
                    if( value != "0" )
                        stream << value;
                    else
                        stream << Colour( Colour::Warning ) << "- none -";
                }
                else if( value != "0" ) {
                    stream  << Colour( Colour::LightGrey ) << " | ";
                    stream  << Colour( it->colour )
                            << value << ' ' << it->label;
                }
            }
            stream << '\n';
        }